

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O2

void bignSeedInc(octet *seed)

{
  byte bVar1;
  ulong uVar2;
  size_t pos;
  long lVar3;
  
  uVar2 = 1;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    bVar1 = seed[lVar3];
    seed[lVar3] = (octet)(uVar2 + bVar1);
    uVar2 = uVar2 + bVar1 >> 8;
  }
  return;
}

Assistant:

static void bignSeedInc(octet seed[8])
{
	register word carry;
	size_t pos;
	ASSERT(memIsValid(seed, 8));
	for (carry = 1, pos = 0; pos < 8; ++pos)
		carry += seed[pos], seed[pos] = (octet)carry, carry >>= 8;
	carry = 0;
}